

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_cgmres.cpp
# Opt level: O2

void __thiscall
InitCGMRES::InitCGMRES(InitCGMRES *this,NMPCModel model,double difference_increment,int dim_krylov)

{
  NMPCModel *this_00;
  int iVar1;
  int iVar2;
  Scalar *pSVar3;
  int i;
  long index;
  
  iVar1 = NMPCModel::dimControlInput(&model);
  iVar2 = NMPCModel::dimConstraints(&model);
  MatrixFreeGMRES::MatrixFreeGMRES(&this->super_MatrixFreeGMRES,iVar1 + iVar2,dim_krylov);
  (this->super_MatrixFreeGMRES)._vptr_MatrixFreeGMRES = (_func_int **)&PTR_bFunc_00145d78;
  this_00 = &this->model_;
  (this->solution_update_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->solution_update_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->incremented_solution_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->incremented_solution_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->lambda_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->lambda_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->error_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->error_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->error_vec_1_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->error_vec_1_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->error_vec_2_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->error_vec_2_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->model_).q[0] = model.q[0];
  (this->model_).q[1] = model.q[1];
  (this->model_).r[0] = model.r[0];
  (this->model_).q_terminal[0] = model.q_terminal[0];
  (this->model_).q_terminal[1] = model.q_terminal[1];
  (this->model_).x_ref[0] = model.x_ref[0];
  (this->model_).x_ref[1] = model.x_ref[1];
  this->difference_increment_ = difference_increment;
  iVar1 = NMPCModel::dimControlInput(this_00);
  iVar2 = NMPCModel::dimConstraints(this_00);
  this->dim_solution_ = iVar2 + iVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->solution_update_vec_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)(iVar2 + iVar1));
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->incremented_solution_vec_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->dim_solution_);
  iVar1 = NMPCModel::dimState(this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->lambda_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)iVar1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->error_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->dim_solution_);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->error_vec_1_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->dim_solution_);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->error_vec_2_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->dim_solution_);
  for (index = 0; index < this->dim_solution_; index = index + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->solution_update_vec_,index);
    *pSVar3 = 0.0;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->error_vec_,index);
    *pSVar3 = 0.0;
  }
  return;
}

Assistant:

InitCGMRES::InitCGMRES(const NMPCModel model, const double difference_increment, const int dim_krylov) : MatrixFreeGMRES(model.dimControlInput()+model.dimConstraints(), dim_krylov)
{
    // Set parameters.
    model_ = model;
    difference_increment_ = difference_increment;
    dim_solution_ = model_.dimControlInput()+model_.dimConstraints();

    // Allocate vectors.
    solution_update_vec_.resize(dim_solution_);
    incremented_solution_vec_.resize(dim_solution_);
    lambda_vec_.resize(model_.dimState());
    error_vec_.resize(dim_solution_);
    error_vec_1_.resize(dim_solution_);
    error_vec_2_.resize(dim_solution_);

    // Initialize solution of the forward-difference GMRES.
    for(int i=0; i<dim_solution_; i++){
        solution_update_vec_(i) = 0.0;
        error_vec_(i) = 0.0;
    }
}